

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O0

char * qulltoa2(char *p,qulonglong n,int base)

{
  long lVar1;
  undefined1 auVar2 [16];
  char cVar3;
  uint uVar4;
  int in_EDX;
  ulong in_RSI;
  char *pcVar5;
  char *in_RDI;
  long in_FS_OFFSET;
  int r_1;
  int r;
  ulong local_18;
  char *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RSI;
  switch(in_EDX) {
  case 2:
    local_10 = in_RDI;
    do {
      pcVar5 = local_10 + -1;
      local_10[-1] = ((byte)local_18 & 1) + 0x30;
      local_18 = local_18 >> 1;
      local_10 = pcVar5;
    } while (local_18 != 0);
    break;
  default:
    local_10 = in_RDI;
    do {
      cVar3 = 'W';
      if ((int)(local_18 % (ulong)(long)in_EDX) < 10) {
        cVar3 = '0';
      }
      pcVar5 = local_10 + -1;
      local_10[-1] = cVar3 + (char)(local_18 % (ulong)(long)in_EDX);
      local_18 = local_18 / (ulong)(long)in_EDX;
      local_10 = pcVar5;
    } while (local_18 != 0);
    break;
  case 8:
    local_10 = in_RDI;
    do {
      pcVar5 = local_10 + -1;
      local_10[-1] = ((byte)local_18 & 7) + 0x30;
      local_18 = local_18 >> 3;
      local_10 = pcVar5;
    } while (local_18 != 0);
    break;
  case 10:
    local_10 = in_RDI;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_18;
      pcVar5 = local_10 + -1;
      local_10[-1] = SUB161(auVar2 % ZEXT816(10),0) + '0';
      local_18 = local_18 / 10;
      local_10 = pcVar5;
    } while (local_18 != 0);
    break;
  case 0x10:
    local_10 = in_RDI;
    do {
      uVar4 = (uint)local_18 & 0xf;
      cVar3 = 'W';
      if (uVar4 < 10) {
        cVar3 = '0';
      }
      pcVar5 = local_10 + -1;
      local_10[-1] = cVar3 + (char)uVar4;
      local_18 = local_18 >> 4;
      local_10 = pcVar5;
    } while (local_18 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

char *qulltoa2(char *p, qulonglong n, int base)
{
#if defined(QT_CHECK_RANGE)
    if (base < 2 || base > 36) {
        qWarning("QByteArray::setNum: Invalid base %d", base);
        base = 10;
    }
#endif
    qulltoString_helper(n, base, p);
    return p;
}